

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void hta::throw_exception<hta::Exception,char_const*,long,char_const*,long>
               (char *args,long args_1,char *args_2,long args_3)

{
  Exception *this;
  string sStack_1d8;
  stringstream msg;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  detail::make_exception<const_char_*,_long,_const_char_*,_long>::operator()
            ((make_exception<const_char_*,_long,_const_char_*,_long> *)&sStack_1d8,&msg,args,args_1,
             args_2,args_3);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this,&sStack_1d8);
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}